

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 __thiscall absl::lts_20250127::operator-(lts_20250127 *this,uint128 val)

{
  undefined1 v [16];
  unsigned___int128 *puVar1;
  long extraout_RDX;
  lts_20250127 *local_28;
  uint128 val_local;
  
  val_local.lo_ = val.lo_;
  local_28 = this;
  puVar1 = uint128::operator_cast_to_unsigned___int128
                     ((unsigned___int128 *)&local_28,(uint128 *)val_local.lo_);
  v._8_8_ = -(ulong)(puVar1 != (unsigned___int128 *)0x0) - extraout_RDX;
  v._0_8_ = -(long)puVar1;
  uint128::uint128((uint128 *)&val_local.hi_,(unsigned___int128)v);
  return stack0xffffffffffffffe8;
}

Assistant:

constexpr uint128 operator-(uint128 val) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  return -static_cast<unsigned __int128>(val);
#else
  return MakeUint128(
      ~Uint128High64(val) + static_cast<unsigned long>(Uint128Low64(val) == 0),
      ~Uint128Low64(val) + 1);
#endif
}